

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.h
# Opt level: O3

void __thiscall
mvm::
interpreter<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>
::
interpret_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_pipe<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)117,(char)115,(char)104,(char)0>>>
          (interpreter<mvm::test::test_instr_set,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>>>
           *this)

{
  iterator __position;
  uint uVar1;
  uint local_14;
  
  uVar1 = consume_bytecode<mvm::bytecode_serializer,unsigned_int>(this);
  ip::increment((ip *)(this + 0x20),1);
  __position._M_current = *(uint **)(this + 0x10);
  if (__position._M_current == *(uint **)(this + 0x18)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 8),__position,
               &local_14);
  }
  else {
    *__position._M_current = uVar1;
    *(uint **)(this + 0x10) = __position._M_current + 1;
  }
  return;
}

Assistant:

void interpreter<Set, InstancesList>::interpret_instr() {
  if constexpr (concept ::is_producer_v<I>) {
    this->produce<
        instance_of_tie_t<instance_list_type,
                          typename traits::producers_traits<I>::producer_type>,
        typename traits::producers_traits<I>::data_type>(this->consume<I>());
  } else {
    this->consume<I>();
  }
}